

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

VerifyPsbtSignRequestStruct * __thiscall
cfd::js::api::json::VerifyPsbtSignRequest::ConvertToStruct
          (VerifyPsbtSignRequestStruct *__return_storage_ptr__,VerifyPsbtSignRequest *this)

{
  _Rb_tree_header *p_Var1;
  vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> local_58;
  vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> local_38;
  
  (__return_storage_ptr__->psbt)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->psbt).field_2
  ;
  (__return_storage_ptr__->psbt)._M_string_length = 0;
  (__return_storage_ptr__->psbt).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->out_point_list).
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->out_point_list).
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->out_point_list).
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  core::JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct>::
  ConvertToStruct(&local_58,&this->out_point_list_);
  local_38.
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->out_point_list).
       super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->out_point_list).
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->out_point_list).
       super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->out_point_list).
       super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->out_point_list).
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->out_point_list).
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::~vector
            (&local_38);
  std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::~vector
            (&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

VerifyPsbtSignRequestStruct VerifyPsbtSignRequest::ConvertToStruct() const {  // NOLINT
  VerifyPsbtSignRequestStruct result;
  result.psbt = psbt_;
  result.out_point_list = out_point_list_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}